

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeclient.c
# Opt level: O2

int on_stream_open(quicly_stream_open_t *self,quicly_stream_t *stream)

{
  int iVar1;
  
  iVar1 = quicly_streambuf_create(stream,0x48);
  if (iVar1 == 0) {
    stream->callbacks = &on_stream_open::stream_callbacks;
  }
  return iVar1;
}

Assistant:

static int on_stream_open(quicly_stream_open_t *self, quicly_stream_t *stream)
{
    static const quicly_stream_callbacks_t stream_callbacks = {
        quicly_streambuf_destroy, quicly_streambuf_egress_shift, quicly_streambuf_egress_emit, on_stop_sending, on_receive,
        on_receive_reset};
    int ret;

    if ((ret = quicly_streambuf_create(stream, sizeof(quicly_streambuf_t))) != 0)
        return ret;
    stream->callbacks = &stream_callbacks;
    return 0;
}